

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  ExpectationBase *pEVar1;
  element_type *peVar2;
  int iVar3;
  ExpectationBase **ppEVar4;
  _Rb_tree_node_base *p_Var5;
  ExpectationBase *__tmp;
  ExpectationBase *next;
  ExpectationBase *local_48;
  ExpectationBase **local_40;
  iterator local_38;
  ExpectationBase **local_30;
  
  ppEVar4 = (ExpectationBase **)operator_new(8);
  local_38._M_current = ppEVar4 + 1;
  *ppEVar4 = this;
  local_40 = ppEVar4;
  local_30 = local_38._M_current;
  do {
    pEVar1 = local_38._M_current[-1];
    local_38._M_current = local_38._M_current + -1;
    p_Var5 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    while ((_Rb_tree_header *)p_Var5 !=
           &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header) {
      local_48 = *(ExpectationBase **)(p_Var5 + 1);
      peVar2 = (local_48->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)(uint)local_48->call_count_);
      if ((char)iVar3 == '\0') {
        std::
        _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
        ::_M_insert_unique<testing::Expectation_const&>
                  ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                    *)result,(Expectation *)(p_Var5 + 1));
      }
      else if (local_48->call_count_ == 0) {
        if (local_38._M_current == local_30) {
          std::
          vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
          ::_M_realloc_insert<testing::internal::ExpectationBase_const*const&>
                    ((vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
                      *)&local_40,local_38,&local_48);
        }
        else {
          *local_38._M_current = local_48;
          local_38._M_current = local_38._M_current + 1;
        }
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      ppEVar4 = local_40;
    }
  } while (ppEVar4 != local_38._M_current);
  if (ppEVar4 != (ExpectationBase **)0x0) {
    operator_delete(ppEVar4,(long)local_30 - (long)ppEVar4);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();

      if (next->IsSatisfied()) {
        // If *it is satisfied and has a call count of 0, some of its
        // pre-requisites may not be satisfied yet.
        if (next->call_count_ == 0) {
          expectations.push_back(next);
        }
      } else {
        // Now that we know next is unsatisfied, we are not so interested
        // in whether its pre-requisites are satisfied.  Therefore we
        // don't iterate into it here.
        *result += *it;
      }
    }
  }
}